

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_it_rec_dc_sse42_intr.c
# Opt level: O3

void ihevcd_itrans_recon_dc_luma_sse42
               (UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 pred_strd,WORD32 dst_strd,
               WORD32 log2_trans_size,WORD16 i2_coeff_value)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  WORD32 i;
  int iVar5;
  __m128i *pi4_dst;
  undefined6 in_register_0000008a;
  int iVar6;
  long lVar7;
  undefined1 auVar8 [16];
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined1 in_XMM1 [16];
  short sVar16;
  short sVar17;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  undefined1 in_XMM2 [16];
  undefined1 auVar18 [16];
  short sVar25;
  undefined1 in_XMM3 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar27 [16];
  
  iVar6 = 1 << ((byte)log2_trans_size & 0x1f);
  auVar8 = ZEXT416(((int)CONCAT62(in_register_0000008a,i2_coeff_value) * 0x40 + 0x40U >> 1) + 0x800
                   >> 0xc);
  auVar8 = pshuflw(auVar8,auVar8,0);
  sVar24 = auVar8._0_2_;
  sVar25 = auVar8._2_2_;
  if (log2_trans_size == 2) {
    uVar1 = *(undefined8 *)pu1_pred;
    lVar4 = (long)pred_strd;
    auVar18._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar18._0_8_ = uVar1;
    auVar18._12_4_ = (int)((ulong)*(undefined8 *)(pu1_pred + lVar4) >> 0x20);
    auVar8._8_8_ = auVar18._8_8_;
    auVar8._0_4_ = (undefined4)uVar1;
    auVar8._4_4_ = (int)*(undefined8 *)(pu1_pred + lVar4);
    uVar1 = *(undefined8 *)(pu1_pred + lVar4 * 2);
    auVar27._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar27._0_8_ = uVar1;
    auVar27._12_4_ = (int)((ulong)*(undefined8 *)(pu1_pred + lVar4 * 3) >> 0x20);
    auVar26._8_8_ = auVar27._8_8_;
    auVar26._0_4_ = (undefined4)uVar1;
    auVar26._4_4_ = (int)*(undefined8 *)(pu1_pred + lVar4 * 3);
    auVar8 = pmovzxbw(auVar8,auVar8);
    auVar18 = pmovzxbw(auVar26,auVar26);
    sVar9 = auVar8._0_2_ + sVar24;
    sVar10 = auVar8._2_2_ + sVar25;
    sVar11 = auVar8._4_2_ + sVar24;
    sVar12 = auVar8._6_2_ + sVar25;
    sVar13 = auVar8._8_2_ + sVar24;
    sVar14 = auVar8._10_2_ + sVar25;
    sVar15 = auVar8._12_2_ + sVar24;
    sVar16 = auVar8._14_2_ + sVar25;
    sVar17 = auVar18._0_2_ + sVar24;
    sVar19 = auVar18._2_2_ + sVar25;
    sVar20 = auVar18._4_2_ + sVar24;
    sVar21 = auVar18._6_2_ + sVar25;
    sVar22 = auVar18._8_2_ + sVar24;
    sVar23 = auVar18._10_2_ + sVar25;
    sVar24 = auVar18._12_2_ + sVar24;
    sVar25 = auVar18._14_2_ + sVar25;
    *pu1_dst = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
    pu1_dst[1] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
    pu1_dst[2] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
    pu1_dst[3] = (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12);
    lVar3 = (long)dst_strd;
    pu1_dst[lVar3 + 4] = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13);
    pu1_dst[lVar3 + 5] = (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14);
    pu1_dst[lVar3 + 6] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
    pu1_dst[lVar3 + 7] = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
    lVar4 = lVar3 * 2;
    pu1_dst[lVar4 + 8] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
    pu1_dst[lVar4 + 9] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
    pu1_dst[lVar4 + 10] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
    pu1_dst[lVar4 + 0xb] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
    lVar3 = lVar3 * 3;
    pu1_dst[lVar3 + 0xc] = (0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22);
    pu1_dst[lVar3 + 0xd] = (0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23);
    pu1_dst[lVar3 + 0xe] = (0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24);
    pu1_dst[lVar3 + 0xf] = (0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25);
  }
  else if (log2_trans_size != 0x1f) {
    lVar4 = (long)pred_strd;
    iVar5 = 1;
    do {
      lVar3 = 0;
      do {
        auVar8 = pmovzxbw(in_XMM1,*(undefined8 *)(pu1_pred + lVar3));
        auVar18 = pmovzxbw(in_XMM2,*(undefined8 *)(pu1_pred + lVar3 + lVar4));
        auVar26 = pmovzxbw(in_XMM3,*(undefined8 *)(pu1_pred + lVar3 + lVar4 * 2));
        auVar27 = pmovzxbw(in_XMM4,*(undefined8 *)(pu1_pred + lVar3 + lVar4 * 3));
        sVar9 = auVar8._0_2_ + sVar24;
        sVar10 = auVar8._2_2_ + sVar25;
        sVar11 = auVar8._4_2_ + sVar24;
        sVar12 = auVar8._6_2_ + sVar25;
        sVar13 = auVar8._8_2_ + sVar24;
        sVar14 = auVar8._10_2_ + sVar25;
        sVar15 = auVar8._12_2_ + sVar24;
        sVar16 = auVar8._14_2_ + sVar25;
        in_XMM2._0_2_ = auVar18._0_2_ + sVar24;
        in_XMM2._2_2_ = auVar18._2_2_ + sVar25;
        in_XMM2._4_2_ = auVar18._4_2_ + sVar24;
        in_XMM2._6_2_ = auVar18._6_2_ + sVar25;
        in_XMM2._8_2_ = auVar18._8_2_ + sVar24;
        in_XMM2._10_2_ = auVar18._10_2_ + sVar25;
        in_XMM2._12_2_ = auVar18._12_2_ + sVar24;
        in_XMM2._14_2_ = auVar18._14_2_ + sVar25;
        in_XMM1._0_8_ =
             CONCAT17((0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16),
                      CONCAT16((0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15),
                               CONCAT15((0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 -
                                        (0xff < sVar14),
                                        CONCAT14((0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 -
                                                 (0xff < sVar13),
                                                 CONCAT13((0 < sVar12) * (sVar12 < 0x100) *
                                                          (char)sVar12 - (0xff < sVar12),
                                                          CONCAT12((0 < sVar11) * (sVar11 < 0x100) *
                                                                   (char)sVar11 - (0xff < sVar11),
                                                                   CONCAT11((0 < sVar10) *
                                                                            (sVar10 < 0x100) *
                                                                            (char)sVar10 -
                                                                            (0xff < sVar10),
                                                                            (0 < sVar9) *
                                                                            (sVar9 < 0x100) *
                                                                            (char)sVar9 -
                                                                            (0xff < sVar9))))))));
        in_XMM1[8] = (0 < in_XMM2._0_2_) * (in_XMM2._0_2_ < 0x100) * (char)in_XMM2._0_2_ -
                     (0xff < in_XMM2._0_2_);
        in_XMM1[9] = (0 < in_XMM2._2_2_) * (in_XMM2._2_2_ < 0x100) * (char)in_XMM2._2_2_ -
                     (0xff < in_XMM2._2_2_);
        in_XMM1[10] = (0 < in_XMM2._4_2_) * (in_XMM2._4_2_ < 0x100) * (char)in_XMM2._4_2_ -
                      (0xff < in_XMM2._4_2_);
        in_XMM1[0xb] = (0 < in_XMM2._6_2_) * (in_XMM2._6_2_ < 0x100) * (char)in_XMM2._6_2_ -
                       (0xff < in_XMM2._6_2_);
        in_XMM1[0xc] = (0 < in_XMM2._8_2_) * (in_XMM2._8_2_ < 0x100) * (char)in_XMM2._8_2_ -
                       (0xff < in_XMM2._8_2_);
        in_XMM1[0xd] = (0 < in_XMM2._10_2_) * (in_XMM2._10_2_ < 0x100) * (char)in_XMM2._10_2_ -
                       (0xff < in_XMM2._10_2_);
        in_XMM1[0xe] = (0 < in_XMM2._12_2_) * (in_XMM2._12_2_ < 0x100) * (char)in_XMM2._12_2_ -
                       (0xff < in_XMM2._12_2_);
        in_XMM1[0xf] = (0 < in_XMM2._14_2_) * (in_XMM2._14_2_ < 0x100) * (char)in_XMM2._14_2_ -
                       (0xff < in_XMM2._14_2_);
        *(undefined8 *)(pu1_dst + lVar3) = in_XMM1._0_8_;
        *(long *)(pu1_dst + lVar3 + dst_strd) = in_XMM1._8_8_;
        sVar9 = auVar26._0_2_ + sVar24;
        sVar10 = auVar26._2_2_ + sVar25;
        sVar11 = auVar26._4_2_ + sVar24;
        sVar12 = auVar26._6_2_ + sVar25;
        sVar13 = auVar26._8_2_ + sVar24;
        sVar14 = auVar26._10_2_ + sVar25;
        sVar15 = auVar26._12_2_ + sVar24;
        sVar16 = auVar26._14_2_ + sVar25;
        in_XMM4._0_2_ = auVar27._0_2_ + sVar24;
        in_XMM4._2_2_ = auVar27._2_2_ + sVar25;
        in_XMM4._4_2_ = auVar27._4_2_ + sVar24;
        in_XMM4._6_2_ = auVar27._6_2_ + sVar25;
        in_XMM4._8_2_ = auVar27._8_2_ + sVar24;
        in_XMM4._10_2_ = auVar27._10_2_ + sVar25;
        in_XMM4._12_2_ = auVar27._12_2_ + sVar24;
        in_XMM4._14_2_ = auVar27._14_2_ + sVar25;
        in_XMM3._0_8_ =
             CONCAT17((0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16),
                      CONCAT16((0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15),
                               CONCAT15((0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 -
                                        (0xff < sVar14),
                                        CONCAT14((0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 -
                                                 (0xff < sVar13),
                                                 CONCAT13((0 < sVar12) * (sVar12 < 0x100) *
                                                          (char)sVar12 - (0xff < sVar12),
                                                          CONCAT12((0 < sVar11) * (sVar11 < 0x100) *
                                                                   (char)sVar11 - (0xff < sVar11),
                                                                   CONCAT11((0 < sVar10) *
                                                                            (sVar10 < 0x100) *
                                                                            (char)sVar10 -
                                                                            (0xff < sVar10),
                                                                            (0 < sVar9) *
                                                                            (sVar9 < 0x100) *
                                                                            (char)sVar9 -
                                                                            (0xff < sVar9))))))));
        in_XMM3[8] = (0 < in_XMM4._0_2_) * (in_XMM4._0_2_ < 0x100) * (char)in_XMM4._0_2_ -
                     (0xff < in_XMM4._0_2_);
        in_XMM3[9] = (0 < in_XMM4._2_2_) * (in_XMM4._2_2_ < 0x100) * (char)in_XMM4._2_2_ -
                     (0xff < in_XMM4._2_2_);
        in_XMM3[10] = (0 < in_XMM4._4_2_) * (in_XMM4._4_2_ < 0x100) * (char)in_XMM4._4_2_ -
                      (0xff < in_XMM4._4_2_);
        in_XMM3[0xb] = (0 < in_XMM4._6_2_) * (in_XMM4._6_2_ < 0x100) * (char)in_XMM4._6_2_ -
                       (0xff < in_XMM4._6_2_);
        in_XMM3[0xc] = (0 < in_XMM4._8_2_) * (in_XMM4._8_2_ < 0x100) * (char)in_XMM4._8_2_ -
                       (0xff < in_XMM4._8_2_);
        in_XMM3[0xd] = (0 < in_XMM4._10_2_) * (in_XMM4._10_2_ < 0x100) * (char)in_XMM4._10_2_ -
                       (0xff < in_XMM4._10_2_);
        in_XMM3[0xe] = (0 < in_XMM4._12_2_) * (in_XMM4._12_2_ < 0x100) * (char)in_XMM4._12_2_ -
                       (0xff < in_XMM4._12_2_);
        in_XMM3[0xf] = (0 < in_XMM4._14_2_) * (in_XMM4._14_2_ < 0x100) * (char)in_XMM4._14_2_ -
                       (0xff < in_XMM4._14_2_);
        *(undefined8 *)(pu1_dst + lVar3 + dst_strd * 2) = in_XMM3._0_8_;
        *(long *)(pu1_dst + lVar3 + dst_strd * 3) = in_XMM3._8_8_;
        lVar7 = lVar3 + 8;
        iVar2 = (int)lVar3;
        lVar3 = lVar7;
      } while (iVar2 + 9 <= iVar6);
      pu1_pred = pu1_pred + lVar7 + (pred_strd * 4 - iVar6);
      pu1_dst = pu1_dst + lVar7 + (dst_strd * 4 - iVar6);
      iVar5 = iVar5 + 4;
    } while (iVar5 <= iVar6);
    return;
  }
  return;
}

Assistant:

void ihevcd_itrans_recon_dc_luma_sse42(UWORD8 *pu1_pred, UWORD8 *pu1_dst, WORD32 pred_strd, WORD32 dst_strd,
                                       WORD32 log2_trans_size, WORD16 i2_coeff_value)
{
    __m128i m_temp_reg_0;
    __m128i m_temp_reg_1;
    __m128i m_temp_reg_2;
    __m128i m_temp_reg_3;
    __m128i m_temp_reg_4;
    __m128i m_temp_reg_5;
    __m128i m_temp_reg_6;
    __m128i m_temp_reg_7;
    __m128i m_temp_reg_8;
    __m128i m_temp_reg_9;
    __m128i m_temp_reg_10;
    __m128i m_temp_reg_11;
    __m128i m_temp_reg_12;
    __m128i m_temp_reg_13;
    __m128i m_temp_reg_14;
    __m128i m_temp_reg_15;
    __m128i m_temp_reg_20, zero_8x16b;
    __m128i *pi4_dst = (__m128i *)pu1_dst;


    //WORD32 row,col;
    WORD32 add, shift;
    WORD32 dc_value, quant_out;
    WORD32 trans_size;




    trans_size = (1 << log2_trans_size);

    quant_out = i2_coeff_value;

    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((quant_out * 64 + add) >> shift);
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((dc_value * 64 + add) >> shift);

    /*Replicate the DC value within 16 bits in 128 bit register*/
    m_temp_reg_20 = _mm_set1_epi16(dc_value);
    zero_8x16b = _mm_setzero_si128();

    if(trans_size == 4)
    {
        WORD32 *pi4_dst = (WORD32 *)pu1_dst;

        m_temp_reg_0 = _mm_loadl_epi64((__m128i *)(pu1_pred));
        m_temp_reg_1 = _mm_loadl_epi64((__m128i *)(pu1_pred + pred_strd));
        m_temp_reg_2 = _mm_loadl_epi64((__m128i *)(pu1_pred + 2 * pred_strd));
        m_temp_reg_3 = _mm_loadl_epi64((__m128i *)(pu1_pred + 3 * pred_strd));

        m_temp_reg_4 = _mm_unpacklo_epi32(m_temp_reg_0, m_temp_reg_1);
        m_temp_reg_5 = _mm_unpacklo_epi32(m_temp_reg_2, m_temp_reg_3);

        m_temp_reg_4 = _mm_unpacklo_epi8(m_temp_reg_4, zero_8x16b);
        m_temp_reg_5 = _mm_unpacklo_epi8(m_temp_reg_5, zero_8x16b);

        m_temp_reg_6 = _mm_add_epi16(m_temp_reg_4, m_temp_reg_20);
        m_temp_reg_7 = _mm_add_epi16(m_temp_reg_5, m_temp_reg_20);

        m_temp_reg_8 = _mm_packus_epi16(m_temp_reg_6, m_temp_reg_7);


        *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_8);
        m_temp_reg_1 = _mm_srli_si128(m_temp_reg_8, 4);
        m_temp_reg_2 = _mm_srli_si128(m_temp_reg_8, 8);
        m_temp_reg_3 = _mm_srli_si128(m_temp_reg_8, 12);
        pu1_dst += dst_strd;
        pi4_dst = (WORD32 *)(pu1_dst);

        *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_1);
        pu1_dst += dst_strd;
        pi4_dst = (WORD32 *)(pu1_dst);

        *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_2);
        pu1_dst += dst_strd;
        pi4_dst = (WORD32 *)(pu1_dst);

        *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_3);
    }
    else
    {
        WORD32 i, j;

        for(i = 1; i <= trans_size; i += 4)
        {
            for(j = 1; j <= trans_size; j += 8)
            {

                m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pu1_pred);
                m_temp_reg_1 = _mm_loadl_epi64((__m128i *)(pu1_pred + pred_strd));
                m_temp_reg_2 = _mm_loadl_epi64((__m128i *)(pu1_pred + 2 * pred_strd));
                m_temp_reg_3 = _mm_loadl_epi64((__m128i *)(pu1_pred + 3 * pred_strd));


                m_temp_reg_4 = _mm_unpacklo_epi8(m_temp_reg_0, zero_8x16b);
                m_temp_reg_5 = _mm_unpacklo_epi8(m_temp_reg_1, zero_8x16b);
                m_temp_reg_6 = _mm_unpacklo_epi8(m_temp_reg_2, zero_8x16b);
                m_temp_reg_7 = _mm_unpacklo_epi8(m_temp_reg_3, zero_8x16b);

                m_temp_reg_8 = _mm_add_epi16(m_temp_reg_4, m_temp_reg_20);
                m_temp_reg_9 = _mm_add_epi16(m_temp_reg_5, m_temp_reg_20);
                m_temp_reg_10 = _mm_add_epi16(m_temp_reg_6, m_temp_reg_20);
                m_temp_reg_11 = _mm_add_epi16(m_temp_reg_7, m_temp_reg_20);

                pi4_dst = (__m128i *)(pu1_dst);

                m_temp_reg_12 = _mm_packus_epi16(m_temp_reg_8, m_temp_reg_9);
                _mm_storel_epi64(pi4_dst, m_temp_reg_12);

                pi4_dst = (__m128i *)(pu1_dst + dst_strd);

                m_temp_reg_13 = _mm_srli_si128(m_temp_reg_12, 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_13);

                pi4_dst = (__m128i *)(pu1_dst + 2 * dst_strd);

                m_temp_reg_14 = _mm_packus_epi16(m_temp_reg_10, m_temp_reg_11);
                _mm_storel_epi64(pi4_dst, m_temp_reg_14);

                pi4_dst = (__m128i *)(pu1_dst + 3 * dst_strd);

                m_temp_reg_15 = _mm_srli_si128(m_temp_reg_14, 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_15);

                pu1_pred += 8;
                pu1_dst += 8;
            }
            pu1_pred += 4 * pred_strd - trans_size;
            pu1_dst += 4 * dst_strd - trans_size;
        }
    }


}